

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O2

void Args::printOffset(OutStreamType *to,size_type currentPos,size_type leftMargin)

{
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  if (currentPos <= leftMargin && leftMargin - currentPos != 0) {
    local_30[0] = local_20;
    std::__cxx11::string::_M_construct((ulong)local_30,(char)(leftMargin - currentPos));
    std::operator<<(to,(string *)local_30);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

static inline void
printOffset( OutStreamType & to, String::size_type currentPos,
	String::size_type leftMargin )
{
	if( currentPos < leftMargin )
		to << String( leftMargin - currentPos, ' ' );
}